

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::Context::setOption(Context *this,char *option,int value)

{
  undefined8 value_00;
  anon_union_24_2_13149d16_for_String_2 local_30;
  
  doctest::toString((String *)&local_30.data,value);
  value_00 = &local_30;
  if (local_30.buf[0x17] < '\0') {
    value_00 = local_30.data.ptr;
  }
  setOption(this,option,(char *)value_00);
  if ((local_30.buf[0x17] < '\0') &&
     ((anon_union_24_2_13149d16_for_String_2 *)local_30.data.ptr !=
      (anon_union_24_2_13149d16_for_String_2 *)0x0)) {
    operator_delete__(local_30.data.ptr);
  }
  return;
}

Assistant:

void Context::setOption(const char* option, int value) {
    setOption(option, toString(value).c_str());
    // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
}